

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# add_subtract.c
# Opt level: O0

void add_subtract(arm7tdmi_t *state,thumbinstr_t *thminstr)

{
  ushort uVar1;
  uint uVar2;
  status_register_t *psVar3;
  ushort *in_RSI;
  arm7tdmi_t *in_RDI;
  uint32_t rndata_1;
  uint32_t rndata;
  uint32_t result;
  uint32_t newvalue;
  add_subtract_t *instr;
  uint32_t value_3;
  uint32_t value_2;
  uint32_t value_1;
  uint32_t value;
  uint32_t result_2;
  uint32_t result_1;
  status_register_t *psr;
  undefined8 in_stack_fffffffffffffe18;
  uint32_t new_pc;
  arm7tdmi_t *in_stack_fffffffffffffe20;
  uint local_190;
  uint local_18c;
  uint32_t local_160;
  uint32_t local_150;
  uint32_t local_140;
  uint32_t local_8c;
  uint32_t local_7c;
  uint32_t local_6c;
  uint32_t local_4c;
  uint32_t local_3c;
  uint32_t local_2c;
  
  uVar2 = (uint)(*in_RSI >> 3 & 7);
  if (((((in_RDI->cpsr).raw & 0x1f) == 0x11) && (7 < uVar2)) && (uVar2 < 0xd)) {
    local_140 = in_RDI->highreg_fiq[uVar2 - 8];
  }
  else if (uVar2 < 0xd) {
    local_140 = in_RDI->r[uVar2];
  }
  else if (uVar2 == 0xd) {
    switch((in_RDI->cpsr).raw & 0x1f) {
    case 0x11:
      local_8c = in_RDI->sp_fiq;
      break;
    case 0x12:
      local_8c = in_RDI->sp_irq;
      break;
    case 0x13:
      local_8c = in_RDI->sp_svc;
      break;
    default:
      local_8c = in_RDI->sp;
      break;
    case 0x17:
      local_8c = in_RDI->sp_abt;
      break;
    case 0x1b:
      local_8c = in_RDI->sp_und;
    }
    local_140 = local_8c;
  }
  else if (uVar2 == 0xe) {
    switch((in_RDI->cpsr).raw & 0x1f) {
    case 0x11:
      local_4c = in_RDI->lr_fiq;
      break;
    case 0x12:
      local_4c = in_RDI->lr_irq;
      break;
    case 0x13:
      local_4c = in_RDI->lr_svc;
      break;
    default:
      local_4c = in_RDI->lr;
      break;
    case 0x17:
      local_4c = in_RDI->lr_abt;
      break;
    case 0x1b:
      local_4c = in_RDI->lr_und;
    }
    local_140 = local_4c;
  }
  else {
    if (uVar2 != 0xf) {
      fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
              "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/../arm7tdmi.h"
              ,0xa4);
      fprintf(_stderr,"Attempted to read unknown register: r%d\n\x1b[0;m",(ulong)uVar2);
      exit(1);
    }
    local_140 = in_RDI->pc;
  }
  if ((*in_RSI >> 9 & 1) == 0) {
    if ((*in_RSI >> 10 & 1) == 0) {
      uVar2 = (uint)(*in_RSI >> 6 & 7);
      if (((((in_RDI->cpsr).raw & 0x1f) == 0x11) && (7 < uVar2)) && (uVar2 < 0xd)) {
        local_160 = in_RDI->highreg_fiq[uVar2 - 8];
      }
      else if (uVar2 < 0xd) {
        local_160 = in_RDI->r[uVar2];
      }
      else if (uVar2 == 0xd) {
        switch((in_RDI->cpsr).raw & 0x1f) {
        case 0x11:
          local_6c = in_RDI->sp_fiq;
          break;
        case 0x12:
          local_6c = in_RDI->sp_irq;
          break;
        case 0x13:
          local_6c = in_RDI->sp_svc;
          break;
        default:
          local_6c = in_RDI->sp;
          break;
        case 0x17:
          local_6c = in_RDI->sp_abt;
          break;
        case 0x1b:
          local_6c = in_RDI->sp_und;
        }
        local_160 = local_6c;
      }
      else if (uVar2 == 0xe) {
        switch((in_RDI->cpsr).raw & 0x1f) {
        case 0x11:
          local_2c = in_RDI->lr_fiq;
          break;
        case 0x12:
          local_2c = in_RDI->lr_irq;
          break;
        case 0x13:
          local_2c = in_RDI->lr_svc;
          break;
        default:
          local_2c = in_RDI->lr;
          break;
        case 0x17:
          local_2c = in_RDI->lr_abt;
          break;
        case 0x1b:
          local_2c = in_RDI->lr_und;
        }
        local_160 = local_2c;
      }
      else {
        if (uVar2 != 0xf) {
          fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                  "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/../arm7tdmi.h"
                  ,0xa4);
          fprintf(_stderr,"Attempted to read unknown register: r%d\n\x1b[0;m",(ulong)uVar2);
          exit(1);
        }
        local_160 = in_RDI->pc;
      }
      (in_RDI->cpsr).raw =
           (in_RDI->cpsr).raw & 0xdfffffff |
           (uint)(0xffffffff < (ulong)local_140 + (ulong)local_160) << 0x1d;
      (in_RDI->cpsr).raw =
           (in_RDI->cpsr).raw & 0xefffffff |
           (uint)(((ulong)(local_140 ^ local_140 + local_160) &
                  ((ulong)local_140 ^ 0xffffffffffffffff ^ (ulong)local_160)) >> 0x1f != 0) << 0x1c;
      uVar2 = (uint)(*in_RSI >> 6 & 7);
      if (((((in_RDI->cpsr).raw & 0x1f) == 0x11) && (7 < uVar2)) && (uVar2 < 0xd)) {
        local_18c = in_RDI->highreg_fiq[uVar2 - 8];
      }
      else if (uVar2 < 0xd) {
        local_18c = in_RDI->r[uVar2];
      }
      else if (uVar2 == 0xd) {
        switch((in_RDI->cpsr).raw & 0x1f) {
        case 0x11:
          local_18c = in_RDI->sp_fiq;
          break;
        case 0x12:
          local_18c = in_RDI->sp_irq;
          break;
        case 0x13:
          local_18c = in_RDI->sp_svc;
          break;
        default:
          local_18c = in_RDI->sp;
          break;
        case 0x17:
          local_18c = in_RDI->sp_abt;
          break;
        case 0x1b:
          local_18c = in_RDI->sp_und;
        }
      }
      else if (uVar2 == 0xe) {
        switch((in_RDI->cpsr).raw & 0x1f) {
        case 0x11:
          local_18c = in_RDI->lr_fiq;
          break;
        case 0x12:
          local_18c = in_RDI->lr_irq;
          break;
        case 0x13:
          local_18c = in_RDI->lr_svc;
          break;
        default:
          local_18c = in_RDI->lr;
          break;
        case 0x17:
          local_18c = in_RDI->lr_abt;
          break;
        case 0x1b:
          local_18c = in_RDI->lr_und;
        }
      }
      else {
        if (uVar2 != 0xf) {
          fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                  "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/../arm7tdmi.h"
                  ,0xa4);
          fprintf(_stderr,"Attempted to read unknown register: r%d\n\x1b[0;m",(ulong)uVar2);
          exit(1);
        }
        local_18c = in_RDI->pc;
      }
    }
    else {
      uVar1 = *in_RSI >> 6 & 7;
      (in_RDI->cpsr).raw =
           (in_RDI->cpsr).raw & 0xdfffffff |
           (uint)(0xffffffff < (ulong)local_140 + (ulong)uVar1) << 0x1d;
      (in_RDI->cpsr).raw =
           (in_RDI->cpsr).raw & 0xefffffff |
           (uint)(((ulong)(local_140 ^ local_140 + uVar1) & ((ulong)local_140 ^ 0xffffffffffffffff))
                  >> 0x1f != 0) << 0x1c;
      local_18c = (uint)(*in_RSI >> 6 & 7);
    }
    local_18c = local_18c + local_140;
  }
  else {
    if ((*in_RSI >> 10 & 1) == 0) {
      uVar2 = (uint)(*in_RSI >> 6 & 7);
      if (((((in_RDI->cpsr).raw & 0x1f) == 0x11) && (7 < uVar2)) && (uVar2 < 0xd)) {
        local_150 = in_RDI->highreg_fiq[uVar2 - 8];
      }
      else if (uVar2 < 0xd) {
        local_150 = in_RDI->r[uVar2];
      }
      else if (uVar2 == 0xd) {
        switch((in_RDI->cpsr).raw & 0x1f) {
        case 0x11:
          local_7c = in_RDI->sp_fiq;
          break;
        case 0x12:
          local_7c = in_RDI->sp_irq;
          break;
        case 0x13:
          local_7c = in_RDI->sp_svc;
          break;
        default:
          local_7c = in_RDI->sp;
          break;
        case 0x17:
          local_7c = in_RDI->sp_abt;
          break;
        case 0x1b:
          local_7c = in_RDI->sp_und;
        }
        local_150 = local_7c;
      }
      else if (uVar2 == 0xe) {
        switch((in_RDI->cpsr).raw & 0x1f) {
        case 0x11:
          local_3c = in_RDI->lr_fiq;
          break;
        case 0x12:
          local_3c = in_RDI->lr_irq;
          break;
        case 0x13:
          local_3c = in_RDI->lr_svc;
          break;
        default:
          local_3c = in_RDI->lr;
          break;
        case 0x17:
          local_3c = in_RDI->lr_abt;
          break;
        case 0x1b:
          local_3c = in_RDI->lr_und;
        }
        local_150 = local_3c;
      }
      else {
        if (uVar2 != 0xf) {
          fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                  "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/../arm7tdmi.h"
                  ,0xa4);
          fprintf(_stderr,"Attempted to read unknown register: r%d\n\x1b[0;m",(ulong)uVar2);
          exit(1);
        }
        local_150 = in_RDI->pc;
      }
      local_190 = local_140 - local_150;
      (in_RDI->cpsr).raw = (in_RDI->cpsr).raw & 0xdfffffff | (uint)(local_150 <= local_140) << 0x1d;
      (in_RDI->cpsr).raw =
           (in_RDI->cpsr).raw & 0xefffffff |
           (uint)((int)((local_140 ^ local_150) & (local_150 ^ 0xffffffff ^ local_190)) < 0) << 0x1c
      ;
    }
    else {
      local_190 = local_140 - (*in_RSI >> 6 & 7);
      uVar2 = (uint)(*in_RSI >> 6 & 7);
      (in_RDI->cpsr).raw = (in_RDI->cpsr).raw & 0xdfffffff | (uint)(uVar2 <= local_140) << 0x1d;
      (in_RDI->cpsr).raw =
           (in_RDI->cpsr).raw & 0xefffffff |
           (uint)((int)((local_140 ^ uVar2) & (uVar2 ^ 0xffffffff ^ local_190)) < 0) << 0x1c;
    }
    local_18c = local_190;
  }
  psVar3 = get_psr(in_RDI);
  psVar3->raw = psVar3->raw & 0xbfffffff | (uint)(local_18c == 0) << 0x1e;
  psVar3->raw = psVar3->raw & 0x7fffffff | (uint)((int)local_18c < 0) << 0x1f;
  uVar2 = (uint)(*in_RSI & 7);
  if (2 < gba_log_verbosity) {
    printf("[DEBUG] Set r%d to 0x%08X\n",(ulong)uVar2,(ulong)local_18c);
  }
  if (((((in_RDI->cpsr).raw & 0x1f) == 0x11) && (7 < uVar2)) && (uVar2 < 0xd)) {
    in_RDI->highreg_fiq[uVar2 - 8] = local_18c;
  }
  else if (uVar2 < 0xd) {
    in_RDI->r[uVar2] = local_18c;
  }
  else if (uVar2 == 0xd) {
    switch((in_RDI->cpsr).raw & 0x1f) {
    case 0x11:
      in_RDI->sp_fiq = local_18c;
      break;
    case 0x12:
      in_RDI->sp_irq = local_18c;
      break;
    case 0x13:
      in_RDI->sp_svc = local_18c;
      break;
    default:
      in_RDI->sp = local_18c;
      break;
    case 0x17:
      in_RDI->sp_abt = local_18c;
      break;
    case 0x1b:
      in_RDI->sp_und = local_18c;
    }
  }
  else if (uVar2 == 0xe) {
    switch((in_RDI->cpsr).raw & 0x1f) {
    case 0x11:
      in_RDI->lr_fiq = local_18c;
      break;
    case 0x12:
      in_RDI->lr_irq = local_18c;
      break;
    case 0x13:
      in_RDI->lr_svc = local_18c;
      break;
    default:
      in_RDI->lr = local_18c;
      break;
    case 0x17:
      in_RDI->lr_abt = local_18c;
      break;
    case 0x1b:
      in_RDI->lr_und = local_18c;
    }
  }
  else {
    if (uVar2 != 0xf) {
      fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
              "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/../arm7tdmi.h"
              ,0xeb);
      fprintf(_stderr,"Attempted to write unknown register: r%d\n\x1b[0;m",(ulong)uVar2);
      exit(1);
    }
    new_pc = (uint32_t)((ulong)in_stack_fffffffffffffe18 >> 0x20);
    if (((in_RDI->cpsr).raw >> 5 & 1) == 0) {
      set_pc(in_stack_fffffffffffffe20,new_pc);
    }
    else {
      set_pc(in_stack_fffffffffffffe20,new_pc);
    }
  }
  return;
}

Assistant:

void add_subtract(arm7tdmi_t* state, thumbinstr_t* thminstr) {
    add_subtract_t* instr = &thminstr->ADD_SUBTRACT;
    word newvalue = get_register(state, instr->rs);
    if (instr->op) { // subtract
        word result = newvalue;
        if (instr->i) {
            result -= instr->rn_or_offset;
            set_flags_sub(state, newvalue, instr->rn_or_offset, result);
        } else {
            word rndata = get_register(state, instr->rn_or_offset);
            result -= rndata;
            set_flags_sub(state, newvalue, rndata, result);
        }
        newvalue = result;
    } else { // add
        if (instr->i) {
            set_flags_add(state, newvalue, instr->rn_or_offset);
            newvalue += instr->rn_or_offset;
        } else {
            word rndata = get_register(state, instr->rn_or_offset);
            set_flags_add(state, newvalue, rndata);
            newvalue += get_register(state, instr->rn_or_offset);
        }
    }

    set_flags_nz(state, newvalue);
    set_register(state, instr->rd, newvalue);
}